

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O3

double __thiscall Problem::getStateCost(Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  vector<node,_std::allocator<node>_> *pvVar1;
  long lVar2;
  double dVar3;
  
  if (0 < (long)this->numCompanies) {
    pvVar1 = this->problemData;
    dVar3 = 0.0;
    lVar2 = 0;
    do {
      dVar3 = dVar3 + (pvVar1->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                      super__Vector_impl_data._M_start
                      [(bidNos->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar2]].price;
      lVar2 = lVar2 + 1;
      pvVar1 = pvVar1 + 1;
    } while (this->numCompanies != lVar2);
    return dVar3;
  }
  return 0.0;
}

Assistant:

double Problem::getStateCost(vector<int> bidNos) {
    double totalCost = 0;
    for (int i = 0; i < this->numCompanies; i++) {
        int curBidNumber = bidNos[i];
        double curcost = this->problemData[i][curBidNumber].price;
        totalCost += curcost;
    }
    return (totalCost);// - 1000000*getStateConflicts(bidNos));
}